

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>>
               (char spec,int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 == 0) {
LAB_00130caf:
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_dec(handler);
    return;
  }
  if (iVar1 != 0x42) {
    if (iVar1 != 0x58) {
      if (iVar1 == 0x62) goto LAB_00130cbf;
      if (iVar1 != 0x78) {
        if (iVar1 == 0x6e) {
          basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_num(handler);
          return;
        }
        if (iVar1 == 0x6f) {
          basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_oct(handler);
          return;
        }
        if (iVar1 != 100) {
          basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_error(handler);
          return;
        }
        goto LAB_00130caf;
      }
    }
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_hex(handler);
    return;
  }
LAB_00130cbf:
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  ::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_bin(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}